

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserDeleteView.cpp
# Opt level: O1

void __thiscall UserDeleteView::display(UserDeleteView *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  BaseUser *pBVar3;
  Application *this_00;
  BaseUser *this_01;
  Controller *this_02;
  View *pVVar4;
  string email;
  string local_60;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter the email of user to delete: ",0x23);
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  Input::getEmail_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_40,(string *)&local_60);
  paVar1 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  pBVar3 = BaseUser::findByEmail(&local_40);
  if (pBVar3 == (BaseUser *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"No user with this email exists.\n",0x20);
  }
  else {
    this_00 = Application::getInstance();
    this_01 = Application::getCurrentUser(this_00);
    BaseUser::getEmail(this_01);
    iVar2 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"You cannot delete yourself!",0x1b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
    }
    else {
      (this->super_DeleteView<BaseUser>).super_View.context.requestObjectId =
           (pBVar3->super_Model<BaseUser>).id;
      DeleteView<BaseUser>::display(&this->super_DeleteView<BaseUser>);
    }
  }
  this_02 = Controller::getInstance();
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"admin-panel","");
  pVVar4 = Controller::getView(this_02,&local_60);
  View::response->view = pVVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void UserDeleteView::display() {
    cout << "Enter the email of user to delete: ";
    string email;
    email = Input::getEmail();
    BaseUser *user = BaseUser::findByEmail(email);
    if (!user) {
        cout << "No user with this email exists.\n";
    }
    else if (Application::getInstance().getCurrentUser()->getEmail() == email)
        cout << "You cannot delete yourself!" << endl;
    else {
        context.requestObjectId = user->getId();
        DeleteView::display();
    }
    response->view = Controller::getInstance().getView("admin-panel");
}